

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O2

void __thiscall
Rml::DecoratorTiledVerticalInstancer::DecoratorTiledVerticalInstancer
          (DecoratorTiledVerticalInstancer *this)

{
  allocator<char> local_52;
  allocator<char> local_51;
  String local_50;
  String local_30;
  
  DecoratorTiledInstancer::DecoratorTiledInstancer(&this->super_DecoratorTiledInstancer,3);
  (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTiledVerticalInstancer_003974d8;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"top-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_50,false);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"bottom-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_50,false);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"center-image",(allocator<char> *)&local_30);
  DecoratorTiledInstancer::RegisterTileProperty
            (&this->super_DecoratorTiledInstancer,&local_50,false);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"decorator",&local_51);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"top-image, center-image, bottom-image",&local_52);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorTiledInstancer).super_DecoratorInstancer.
              super_EffectSpecification,&local_50,&local_30,RecursiveCommaSeparated);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

DecoratorTiledVerticalInstancer::DecoratorTiledVerticalInstancer() : DecoratorTiledInstancer(3)
{
	RegisterTileProperty("top-image");
	RegisterTileProperty("bottom-image");
	RegisterTileProperty("center-image");
	RegisterShorthand("decorator", "top-image, center-image, bottom-image", ShorthandType::RecursiveCommaSeparated);
}